

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O0

void __thiscall
Builder::Builder(Builder *this,State *state,BuildConfig *config,BuildLog *build_log,
                DepsLog *deps_log,DiskInterface *disk_interface,Status *status,
                int64_t start_time_millis)

{
  DiskInterface *disk_interface_local;
  DepsLog *deps_log_local;
  BuildLog *build_log_local;
  BuildConfig *config_local;
  State *state_local;
  Builder *this_local;
  
  this->state_ = state;
  this->config_ = config;
  Plan::Plan(&this->plan_,this);
  std::unique_ptr<CommandRunner,std::default_delete<CommandRunner>>::
  unique_ptr<std::default_delete<CommandRunner>,void>
            ((unique_ptr<CommandRunner,std::default_delete<CommandRunner>> *)&this->command_runner_)
  ;
  this->status_ = status;
  std::
  map<const_Edge_*,_int,_std::less<const_Edge_*>,_std::allocator<std::pair<const_Edge_*const,_int>_>_>
  ::map(&this->running_edges_);
  this->start_time_millis_ = start_time_millis;
  this->disk_interface_ = disk_interface;
  DependencyScan::DependencyScan
            (&this->scan_,state,build_log,deps_log,disk_interface,
             (DepfileParserOptions *)(this->config_ + 0x20));
  return;
}

Assistant:

Builder::Builder(State* state, const BuildConfig& config,
                 BuildLog* build_log, DepsLog* deps_log,
                 DiskInterface* disk_interface, Status *status,
                 int64_t start_time_millis)
    : state_(state), config_(config), plan_(this), status_(status),
      start_time_millis_(start_time_millis), disk_interface_(disk_interface),
      scan_(state, build_log, deps_log, disk_interface,
            &config_.depfile_parser_options) {
}